

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixellayout.cpp
# Opt level: O2

QRgbaFloat<float> *
fetchAlpha8To<QRgbaFloat<float>>
          (QRgbaFloat<float> *buffer,uchar *src,int index,int count,QList<unsigned_int> *param_5,
          QDitherInfo *param_6)

{
  undefined4 *puVar1;
  byte bVar2;
  ulong uVar3;
  byte *pbVar4;
  ulong uVar5;
  
  uVar5 = 0;
  uVar3 = (ulong)(uint)count;
  if (count < 1) {
    uVar3 = uVar5;
  }
  pbVar4 = src + index;
  for (; uVar3 * 0x10 != uVar5; uVar5 = uVar5 + 0x10) {
    bVar2 = *pbVar4;
    puVar1 = (undefined4 *)((long)&buffer->r + uVar5);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1[2] = 0;
    puVar1[3] = (float)bVar2 * 0.003921569;
    pbVar4 = pbVar4 + 1;
  }
  return buffer;
}

Assistant:

static const QRgba *QT_FASTCALL fetchAlpha8To(QRgba *buffer, const uchar *src, int index, int count,
                                              const QList<QRgb> *, QDitherInfo *)
{
    for (int i = 0; i < count; ++i)
        buffer[i] = QRgba::fromRgba(0, 0, 0, src[index + i]);
    return buffer;
}